

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O0

void __thiscall Assimp::XFileExporter::~XFileExporter(XFileExporter *this)

{
  aiScene *this_00;
  XFileExporter *this_local;
  
  this->_vptr_XFileExporter = (_func_int **)&PTR__XFileExporter_00f3d710;
  if (((this->mSceneOwned & 1U) != 0) && (this_00 = this->mScene, this_00 != (aiScene *)0x0)) {
    aiScene::~aiScene(this_00);
    operator_delete(this_00,0x80);
  }
  std::__cxx11::string::~string((string *)&this->endstr);
  std::__cxx11::string::~string((string *)&this->startstr);
  std::__cxx11::string::~string((string *)&this->mFile);
  std::__cxx11::string::~string((string *)&this->mPath);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->mOutput);
  return;
}

Assistant:

XFileExporter::~XFileExporter()
{
    if(mSceneOwned) {
        delete mScene;
    }
}